

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

bool __thiscall
InstructionVMEvalContext::Storage::Reserve
          (Storage *this,InstructionVMEvalContext *ctx,uint offset,uint size)

{
  uint index;
  uint uVar1;
  char *__s;
  uint uVar2;
  
  index = (this->data).count;
  uVar2 = offset + size;
  uVar1 = ctx->frameMemoryLimit;
  if (index < uVar2 && uVar2 < uVar1) {
    SmallArray<char,_128U>::resize(&this->data,uVar2 + 0x20);
    __s = SmallArray<char,_128U>::operator[](&this->data,index);
    memset(__s,0,(ulong)((this->data).count - index));
  }
  return uVar2 < uVar1;
}

Assistant:

bool InstructionVMEvalContext::Storage::Reserve(InstructionVMEvalContext &ctx, unsigned offset, unsigned size)
{
	unsigned oldSize = data.size();
	unsigned newSize = offset + size;

	if(newSize >= ctx.frameMemoryLimit)
		return false;

	if(newSize > oldSize)
	{
		data.resize(newSize + 32);

		memset(&data[oldSize], 0, data.size() - oldSize);
	}

	return true;
}